

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O1

void __thiscall
CTxMemPool::UpdateForRemoveFromMempool
          (CTxMemPool *this,setEntries *entriesToRemove,bool updateDescendants)

{
  size_type *psVar1;
  int iVar2;
  long lVar3;
  index_node_type *x;
  txiter it;
  bool bVar4;
  _Rb_tree_header *p_Var5;
  int64_t iVar6;
  _Base_ptr p_Var7;
  CTxMemPool *pCVar8;
  _Rb_tree_node_base *p_Var9;
  undefined7 in_register_00000011;
  CTxMemPoolEntry *entry;
  CTxMemPool *this_00;
  long in_FS_OFFSET;
  string_view calling_fn_name;
  pair<std::_Rb_tree_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>,_std::_Rb_tree_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  pVar10;
  setEntries *__range1;
  txiter removeIt;
  setEntries setDescendants;
  Limits local_88;
  _Rb_tree<_270907ca_> local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000011,updateDescendants) != 0) {
    pCVar8 = (CTxMemPool *)(entriesToRemove->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var5 = &(entriesToRemove->_M_t)._M_impl.super__Rb_tree_header;
    if (pCVar8 != (CTxMemPool *)p_Var5) {
      this_00 = this;
      do {
        local_88.ancestor_count = pCVar8->lastRollingFeeUpdate;
        local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_68._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_68._M_impl.super__Rb_tree_header._M_header;
        local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_68._M_impl.super__Rb_tree_header._M_header._M_right =
             local_68._M_impl.super__Rb_tree_header._M_header._M_left;
        CalculateDescendants(this_00,(txiter)local_88.ancestor_count,(setEntries *)&local_68);
        pVar10 = std::_Rb_tree<$270907ca$>::equal_range(&local_68,(key_type *)&local_88);
        std::_Rb_tree<$270907ca$>::_M_erase_aux
                  (&local_68,(_Base_ptr)pVar10.first._M_node,(_Base_ptr)pVar10.second._M_node);
        iVar6 = GetVirtualTransactionSize
                          ((long)*(int *)((long)&(((
                                                  hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                                  *)local_88.ancestor_count)->
                                                 super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                                 ).
                                                 super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                                 .
                                                 super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                                 .
                                                 super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                                 .super_pod_value_holder<CTxMemPoolEntry>.space +
                                         0x78),
                           *(int64_t *)
                            ((long)&(((hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                       *)local_88.ancestor_count)->
                                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                    ).
                                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                    .
                                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                    .
                                    super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                    .super_pod_value_holder<CTxMemPoolEntry>.space + 0xa0),
                           nBytesPerSigOp);
        if ((_Rb_tree_header *)local_68._M_impl.super__Rb_tree_header._M_header._M_left !=
            &local_68._M_impl.super__Rb_tree_header) {
          lVar3 = *(long *)((long)&(((hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                      *)local_88.ancestor_count)->
                                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                   ).
                                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                   .
                                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                   .
                                   super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                   .super_pod_value_holder<CTxMemPoolEntry>.space + 0xa8);
          iVar2 = *(int *)((long)&(((hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                     *)local_88.ancestor_count)->
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                  ).
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                  .
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                  .
                                  super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                  .super_pod_value_holder<CTxMemPoolEntry>.space + 0xa0);
          p_Var7 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            x = *(index_node_type **)(p_Var7 + 1);
            CTxMemPoolEntry::UpdateAncestorState
                      ((CTxMemPoolEntry *)x,-(int)iVar6,-lVar3,-1,(long)-iVar2);
            bVar4 = boost::multi_index::detail::
                    hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
                    ::modify_(&(this->mapTx).super_type,x);
            if (!bVar4) {
              std::
              allocator_traits<std::allocator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_>_>
              ::destroy<CTxMemPoolEntry>((allocator_type *)&this->mapTx,(CTxMemPoolEntry *)x);
              operator_delete(x,0x178);
              psVar1 = &(this->mapTx).node_count;
              *psVar1 = *psVar1 - 1;
            }
            p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
          } while ((_Rb_tree_header *)p_Var7 != &local_68._M_impl.super__Rb_tree_header);
        }
        std::_Rb_tree<$270907ca$>::~_Rb_tree(&local_68);
        this_00 = pCVar8;
        pCVar8 = (CTxMemPool *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar8);
      } while (pCVar8 != (CTxMemPool *)p_Var5);
    }
  }
  p_Var7 = (entriesToRemove->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(entriesToRemove->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var5) {
    do {
      it.node = *(hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                  **)(p_Var7 + 1);
      local_88.ancestor_count = 0x7fffffffffffffff;
      local_88.ancestor_size_vbytes = 0x7fffffffffffffff;
      local_88.descendant_count = 0x7fffffffffffffff;
      local_88.descendant_size_vbytes = 0x7fffffffffffffff;
      calling_fn_name._M_str = "UpdateForRemoveFromMempool";
      calling_fn_name._M_len = 0x1a;
      AssumeCalculateMemPoolAncestors
                ((setEntries *)&local_68,this,calling_fn_name,(CTxMemPoolEntry *)it.node,&local_88,
                 false);
      UpdateAncestorsOf(this,false,it,(setEntries *)&local_68);
      std::_Rb_tree<$270907ca$>::~_Rb_tree(&local_68);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var5);
  }
  for (p_Var9 = (entriesToRemove->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var9 != p_Var5;
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
    UpdateChildrenForRemoval
              (this,*(hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                      **)(p_Var9 + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CTxMemPool::UpdateForRemoveFromMempool(const setEntries &entriesToRemove, bool updateDescendants)
{
    // For each entry, walk back all ancestors and decrement size associated with this
    // transaction
    if (updateDescendants) {
        // updateDescendants should be true whenever we're not recursively
        // removing a tx and all its descendants, eg when a transaction is
        // confirmed in a block.
        // Here we only update statistics and not data in CTxMemPool::Parents
        // and CTxMemPoolEntry::Children (which we need to preserve until we're
        // finished with all operations that need to traverse the mempool).
        for (txiter removeIt : entriesToRemove) {
            setEntries setDescendants;
            CalculateDescendants(removeIt, setDescendants);
            setDescendants.erase(removeIt); // don't update state for self
            int32_t modifySize = -removeIt->GetTxSize();
            CAmount modifyFee = -removeIt->GetModifiedFee();
            int modifySigOps = -removeIt->GetSigOpCost();
            for (txiter dit : setDescendants) {
                mapTx.modify(dit, [=](CTxMemPoolEntry& e){ e.UpdateAncestorState(modifySize, modifyFee, -1, modifySigOps); });
            }
        }
    }
    for (txiter removeIt : entriesToRemove) {
        const CTxMemPoolEntry &entry = *removeIt;
        // Since this is a tx that is already in the mempool, we can call CMPA
        // with fSearchForParents = false.  If the mempool is in a consistent
        // state, then using true or false should both be correct, though false
        // should be a bit faster.
        // However, if we happen to be in the middle of processing a reorg, then
        // the mempool can be in an inconsistent state.  In this case, the set
        // of ancestors reachable via GetMemPoolParents()/GetMemPoolChildren()
        // will be the same as the set of ancestors whose packages include this
        // transaction, because when we add a new transaction to the mempool in
        // addUnchecked(), we assume it has no children, and in the case of a
        // reorg where that assumption is false, the in-mempool children aren't
        // linked to the in-block tx's until UpdateTransactionsFromBlock() is
        // called.
        // So if we're being called during a reorg, ie before
        // UpdateTransactionsFromBlock() has been called, then
        // GetMemPoolParents()/GetMemPoolChildren() will differ from the set of
        // mempool parents we'd calculate by searching, and it's important that
        // we use the cached notion of ancestor transactions as the set of
        // things to update for removal.
        auto ancestors{AssumeCalculateMemPoolAncestors(__func__, entry, Limits::NoLimits(), /*fSearchForParents=*/false)};
        // Note that UpdateAncestorsOf severs the child links that point to
        // removeIt in the entries for the parents of removeIt.
        UpdateAncestorsOf(false, removeIt, ancestors);
    }
    // After updating all the ancestor sizes, we can now sever the link between each
    // transaction being removed and any mempool children (ie, update CTxMemPoolEntry::m_parents
    // for each direct child of a transaction being removed).
    for (txiter removeIt : entriesToRemove) {
        UpdateChildrenForRemoval(removeIt);
    }
}